

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnswerLiteralManager.cpp
# Opt level: O3

TermList Shell::AnswerLiteralManager::possiblyEvaluateAnswerTerm(TermList aT)

{
  bool bVar1;
  uint predicate;
  OperatorKey *key;
  OperatorType *type;
  Literal *lit;
  size_type extraout_RDX;
  initializer_list<Kernel::TermList> sorts;
  bool constTrue;
  bool constant;
  Literal *res;
  InterpretedLiteralEvaluator eval;
  bool local_82;
  bool local_81;
  undefined1 local_80 [104];
  
  if (((aT._content & 3) == 0) && (*(uint *)(aT._content + 8) < 0xfffffff9)) {
    Kernel::InterpretedLiteralEvaluator::InterpretedLiteralEvaluator
              ((InterpretedLiteralEvaluator *)(local_80 + 8),true);
    predicate = Kernel::Signature::addFreshPredicate(DAT_00b521b0,1,"p",(char *)0x0);
    local_80._0_8_ = Kernel::SortHelper::getResultSort((Term *)aT._content);
    sorts._M_len = extraout_RDX;
    sorts._M_array = (iterator)0x1;
    key = Kernel::OperatorType::setupKey((OperatorType *)local_80,sorts);
    *(undefined8 *)(key + 0x10) = 2;
    type = Kernel::OperatorType::getTypeFromKey(key,0);
    Kernel::Signature::Symbol::setType((DAT_00b521b0->_preds)._stack[predicate],type);
    lit = Kernel::Literal::create1(predicate,true,aT);
    local_80._0_8_ = (OperatorKey *)0x0;
    bVar1 = Kernel::InterpretedLiteralEvaluator::evaluate
                      ((InterpretedLiteralEvaluator *)(local_80 + 8),lit,&local_81,
                       (Literal **)local_80,&local_82);
    if (bVar1 && (OperatorKey *)local_80._0_8_ != (OperatorKey *)0x0) {
      aT._content = *(uint64_t *)
                     (local_80._0_8_ +
                     (ulong)(*(uint *)(local_80._0_8_ + 0xc) & 0xfffffff) * 8 + 0x28);
    }
    Kernel::InterpretedLiteralEvaluator::~InterpretedLiteralEvaluator
              ((InterpretedLiteralEvaluator *)(local_80 + 8));
  }
  return (TermList)aT._content;
}

Assistant:

TermList AnswerLiteralManager::possiblyEvaluateAnswerTerm(TermList aT)
{
  if(aT.isTerm() && !aT.term()->isSpecial()){
    InterpretedLiteralEvaluator eval;
    unsigned p = env.signature->addFreshPredicate(1,"p");
    TermList sort = SortHelper::getResultSort(aT.term());
    OperatorType* type = OperatorType::getPredicateType({sort});
    env.signature->getPredicate(p)->setType(type);
    Literal* l = Literal::create1(p,true,aT);
    Literal* res =0;
    bool constant, constTrue;
    bool litMod = eval.evaluate(l,constant,res,constTrue);
    if(litMod && res){
      aT.setTerm(res->nthArgument(0)->term());
    }
  }
  return aT;
}